

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O2

void supgnam(char *buf,tokthdef *tab,objnum objn)

{
  int iVar1;
  toksdef sym;
  
  if (tab == (tokthdef *)0x0) {
    builtin_strncpy(buf,"<NO SYMBOL TABLE>",0x12);
  }
  else {
    iVar1 = tokthfind(&tab->tokthsc,2,(uint)objn,&sym);
    if ((iVar1 == 0) && (iVar1 = tokthfind(&tab->tokthsc,7,(uint)objn,&sym), iVar1 == 0)) {
      builtin_strncpy(buf,"<UNKNOWN>",10);
      return;
    }
    memcpy(buf,sym.toksnam,(ulong)sym.tokslen);
    buf[sym.tokslen] = '\0';
  }
  return;
}

Assistant:

void supgnam(char *buf, tokthdef *tab, objnum objn)
{
    toksdef sym;
    
    if (!tab)
    {
        strcpy(buf, "<NO SYMBOL TABLE>");
        return;
    }
    
    if (tokthfind((toktdef *)tab, TOKSTOBJ, (uint)objn, &sym)
        || tokthfind((toktdef *)tab, TOKSTFWDOBJ, (uint)objn, &sym))
    {
        memcpy(buf, sym.toksnam, (size_t)sym.tokslen);
        buf[sym.tokslen] = '\0';
        return;
    }

    strcpy(buf, "<UNKNOWN>");
}